

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

CustomExternalWrapperObject * __thiscall
Js::CustomExternalWrapperObject::Copy(CustomExternalWrapperObject *this,bool deepCopy)

{
  Type *pTVar1;
  Recycler *pRVar2;
  CustomExternalWrapperObject *this_00;
  Type TVar3;
  code *AllocFunc;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pRVar2 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  pTVar1 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  TVar3 = 0;
  if (this->slotType != External) {
    TVar3 = (this->u).inlineSlotSize;
  }
  if (pTVar1[1].prototype.ptr == (RecyclableObject *)0x0) {
    data.typeinfo = (type_info *)(long)(int)TVar3;
    if (pTVar1[1].entryPoint == (Type)0x0) {
      local_48 = (undefined1  [8])&typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_6088375;
      data.filename._0_4_ = 0x9f;
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
      AllocFunc = Memory::Recycler::Alloc;
    }
    else {
      local_48 = (undefined1  [8])&typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_6088375;
      data.filename._0_4_ = 0x9b;
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
      AllocFunc = Memory::Recycler::AllocFinalized;
    }
  }
  else {
    data.typeinfo = (type_info *)(long)(int)TVar3;
    local_48 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_6088375;
    data.filename._0_4_ = 0x97;
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
    AllocFunc = Memory::Recycler::AllocTracked;
  }
  this_00 = (CustomExternalWrapperObject *)
            new<Memory::Recycler>(0x30,pRVar2,(offset_in_Recycler_to_subr)AllocFunc,0);
  CustomExternalWrapperObject(this_00,this,deepCopy);
  return this_00;
}

Assistant:

CustomExternalWrapperObject* CustomExternalWrapperObject::Copy(bool deepCopy)
{
    Recycler* recycler = this->GetRecycler();
    CustomExternalWrapperType* externalType = this->GetExternalType();
    int inlineSlotSize = this->GetInlineSlotSize();

    if (externalType->GetJsTraceCallback() != nullptr)
    {
        return RecyclerNewTrackedPlus(recycler, inlineSlotSize, CustomExternalWrapperObject, this, deepCopy);
    }
    else if (externalType->GetJsFinalizeCallback() != nullptr)
    {
        return RecyclerNewFinalizedPlus(recycler, inlineSlotSize, CustomExternalWrapperObject, this, deepCopy);
    }
    else
    {
        return RecyclerNewPlus(recycler, inlineSlotSize, CustomExternalWrapperObject, this, deepCopy);
    }
}